

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogWriter.h
# Opt level: O0

void __thiscall LogWriter::~LogWriter(LogWriter *this)

{
  LogWriter *in_RDI;
  
  ~LogWriter(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

LogWriter(std::string fn) : vertices_(), logfile_(fn, std::ofstream::out), filename_(fn), iteration_(0) {}